

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O2

int yy_list_infix_expr(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char *cclass;
  char *cclass_00;
  char *cclass_01;
  int yypos736;
  int yythunkpos736;
  
  iVar1 = G->pos;
  iVar2 = G->thunkpos;
  iVar4 = 0;
  yyDo(G,yyPush,2,0,"yyPush");
  iVar3 = yy_comma_operator_expr(G);
  if (iVar3 == 0) {
    G->pos = iVar1;
    G->thunkpos = iVar2;
  }
  else {
    yyDo(G,yySet,-2,0,"yySet");
    yyDo(G,yy_1_list_infix_expr,G->begin,G->end,"yy_1_list_infix_expr");
LAB_0011599b:
    while( true ) {
      iVar1 = G->pos;
      iVar2 = G->thunkpos;
      yy__(G);
      iVar4 = yymatchChar(G,0x5a);
      if (iVar4 == 0) break;
      iVar4 = G->pos;
      iVar3 = G->thunkpos;
      iVar5 = yymatchClass(G,(uchar *)"",cclass);
      if (iVar5 != 0) break;
      G->pos = iVar4;
      G->thunkpos = iVar3;
      yy__(G);
      iVar4 = yy_comma_operator_expr(G);
      if (iVar4 == 0) break;
      yyDo(G,yySet,-1,0,"yySet");
      yyDo(G,yy_2_list_infix_expr,G->begin,G->end,"yy_2_list_infix_expr");
    }
    G->pos = iVar1;
    G->thunkpos = iVar2;
    yy__(G);
    iVar4 = yymatchString(G,"minmax");
    if (iVar4 != 0) {
      iVar4 = G->pos;
      iVar3 = G->thunkpos;
      iVar5 = yymatchClass(G,(uchar *)"",cclass_00);
      if (iVar5 == 0) {
        G->pos = iVar4;
        G->thunkpos = iVar3;
        yy__(G);
        iVar4 = yy_comma_operator_expr(G);
        if (iVar4 != 0) {
          yyDo(G,yySet,-1,0,"yySet");
          yyDo(G,yy_3_list_infix_expr,G->begin,G->end,"yy_3_list_infix_expr");
          goto LAB_0011599b;
        }
      }
    }
    G->pos = iVar1;
    G->thunkpos = iVar2;
    yy__(G);
    iVar4 = yymatchString(G,"...");
    if (iVar4 != 0) {
      iVar4 = G->pos;
      iVar3 = G->thunkpos;
      iVar5 = yymatchClass(G,(uchar *)"",cclass_01);
      if (iVar5 != 0) goto LAB_00115b67;
      G->pos = iVar4;
      G->thunkpos = iVar3;
      yy__(G);
      iVar4 = yy_comma_operator_expr(G);
      if (iVar4 == 0) goto LAB_00115b67;
      yyDo(G,yySet,-1,0,"yySet");
      yyDo(G,yy_4_list_infix_expr,G->begin,G->end,"yy_4_list_infix_expr");
      goto LAB_0011599b;
    }
LAB_00115b67:
    G->pos = iVar1;
    G->thunkpos = iVar2;
    yyDo(G,yyPop,2,0,"yyPop");
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

YY_RULE(int) yy_list_infix_expr(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyDo(G, yyPush, 2, 0, "yyPush");
  yyprintfv((stderr, "%s\n", "list_infix_expr"));
  if (!yy_comma_operator_expr(G))  goto l733;
  yyDo(G, yySet, -2, 0, "yySet");
  yyDo(G, yy_1_list_infix_expr, G->begin, G->end, "yy_1_list_infix_expr");

  l734:;	
  {  int yypos735= G->pos, yythunkpos735= G->thunkpos;
  {  int yypos736= G->pos, yythunkpos736= G->thunkpos;  if (!yy__(G))  goto l737;
  if (!yymatchChar(G, 'Z')) goto l737;

  {  int yypos738= G->pos, yythunkpos738= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\040\377\003\376\377\377\207\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "-_a-zA-Z0-9")) goto l738;
  goto l737;
  l738:;	  G->pos= yypos738; G->thunkpos= yythunkpos738;
  }  if (!yy__(G))  goto l737;
  if (!yy_comma_operator_expr(G))  goto l737;
  yyDo(G, yySet, -1, 0, "yySet");
  yyDo(G, yy_2_list_infix_expr, G->begin, G->end, "yy_2_list_infix_expr");
  goto l736;
  l737:;	  G->pos= yypos736; G->thunkpos= yythunkpos736;  if (!yy__(G))  goto l739;
  if (!yymatchString(G, "minmax")) goto l739;

  {  int yypos740= G->pos, yythunkpos740= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\040\377\003\376\377\377\207\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "-_a-zA-Z0-9")) goto l740;
  goto l739;
  l740:;	  G->pos= yypos740; G->thunkpos= yythunkpos740;
  }  if (!yy__(G))  goto l739;
  if (!yy_comma_operator_expr(G))  goto l739;
  yyDo(G, yySet, -1, 0, "yySet");
  yyDo(G, yy_3_list_infix_expr, G->begin, G->end, "yy_3_list_infix_expr");
  goto l736;
  l739:;	  G->pos= yypos736; G->thunkpos= yythunkpos736;  if (!yy__(G))  goto l735;
  if (!yymatchString(G, "...")) goto l735;

  {  int yypos741= G->pos, yythunkpos741= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\140\377\003\376\377\377\207\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "-._a-zA-Z0-9")) goto l741;
  goto l735;
  l741:;	  G->pos= yypos741; G->thunkpos= yythunkpos741;
  }  if (!yy__(G))  goto l735;
  if (!yy_comma_operator_expr(G))  goto l735;
  yyDo(G, yySet, -1, 0, "yySet");
  yyDo(G, yy_4_list_infix_expr, G->begin, G->end, "yy_4_list_infix_expr");

  }
  l736:;	  goto l734;
  l735:;	  G->pos= yypos735; G->thunkpos= yythunkpos735;
  }  yyprintf((stderr, "  ok   list_infix_expr"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));
  yyDo(G, yyPop, 2, 0, "yyPop");
  return 1;
  l733:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "list_infix_expr"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}